

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_01;
  string *psVar3;
  ulong uVar4;
  cmComputeLinkInformation *this_02;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *this_03;
  reference ppcVar5;
  mapped_type *this_04;
  ostream *poVar6;
  reference ppVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2_1;
  string local_1c8;
  undefined1 local_1a8 [8];
  string for_install_1;
  string for_build_1;
  string new_id;
  string fname;
  string for_install;
  string for_build;
  cmGeneratorTarget *tgt;
  iterator __end2;
  iterator __begin2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range2;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *sharedLibs;
  cmComputeLinkInformation *cli;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  allocator<char> local_71;
  string local_70;
  string local_50 [8];
  string installNameTool;
  string *toDestDirPath_local;
  string *config_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  if (((this->ImportLibrary & 1U) == 0) &&
     (((installNameTool.field_2._8_8_ = toDestDirPath,
       TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == SHARED_LIBRARY ||
       (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == MODULE_LIBRARY)) ||
      (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == EXECUTABLE)))) {
    this_01 = cmTarget::GetMakefile(this->Target->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_INSTALL_NAME_TOOL",&local_71);
    psVar3 = cmMakefile::GetSafeDefinition(this_01,&local_70);
    std::__cxx11::string::string(local_50,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&cli);
      this_02 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
      if (this_02 != (cmComputeLinkInformation *)0x0) {
        this_03 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_02);
        __end2 = std::
                 set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(this_03);
        tgt = (cmGeneratorTarget *)
              std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::end(this_03);
        while (bVar1 = std::operator!=(&__end2,(_Self *)&tgt), bVar1) {
          ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end2);
          this_00 = *ppcVar5;
          bVar1 = cmGeneratorTarget::IsImported(this_00);
          if (!bVar1) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree
                      ((string *)((long)&for_install.field_2 + 8),this_00,config);
            cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_
                      ((string *)((long)&fname.field_2 + 8),this_00);
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&for_install.field_2 + 8),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&fname.field_2 + 8));
            if (bVar1) {
              GetInstallFilename((string *)((long)&new_id.field_2 + 8),this_00,config,NameSO);
              std::__cxx11::string::operator+=
                        ((string *)(for_install.field_2._M_local_buf + 8),
                         (string *)(new_id.field_2._M_local_buf + 8));
              std::__cxx11::string::operator+=
                        ((string *)(fname.field_2._M_local_buf + 8),
                         (string *)(new_id.field_2._M_local_buf + 8));
              this_04 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&cli,(key_type *)((long)&for_install.field_2 + 8));
              std::__cxx11::string::operator=
                        ((string *)this_04,(string *)(fname.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(new_id.field_2._M_local_buf + 8));
            }
            std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(for_install.field_2._M_local_buf + 8));
          }
          std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end2);
        }
      }
      std::__cxx11::string::string((string *)(for_build_1.field_2._M_local_buf + 8));
      TVar2 = cmGeneratorTarget::GetType(this->Target);
      if (TVar2 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree
                  ((string *)((long)&for_install_1.field_2 + 8),this->Target,config);
        cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_
                  ((string *)local_1a8,this->Target);
        bVar1 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
        if (bVar1) {
          std::__cxx11::string::empty();
        }
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&for_install_1.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1a8);
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)(for_build_1.field_2._M_local_buf + 8),(string *)local_1a8);
          GetInstallFilename(&local_1c8,this->Target,config,NameSO);
          std::__cxx11::string::operator+=
                    ((string *)(for_build_1.field_2._M_local_buf + 8),(string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        std::__cxx11::string::~string((string *)local_1a8);
        std::__cxx11::string::~string((string *)(for_install_1.field_2._M_local_buf + 8));
      }
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) ||
         (bVar1 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&cli), !bVar1)) {
        poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar6 = std::operator<<(poVar6,"execute_process(COMMAND \"");
        std::operator<<(poVar6,local_50);
        std::operator<<(os,"\"");
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          poVar6 = std::operator<<(os,"\n");
          poVar6 = ::operator<<(poVar6,(cmScriptGeneratorIndent)indent.Level);
          poVar6 = std::operator<<(poVar6,"  -id \"");
          poVar6 = std::operator<<(poVar6,(string *)(for_build_1.field_2._M_local_buf + 8));
          std::operator<<(poVar6,"\"");
        }
        __end2_1 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&cli);
        i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&cli);
        while (bVar1 = std::operator!=(&__end2_1,(_Self *)&i), bVar1) {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&__end2_1);
          poVar6 = std::operator<<(os,"\n");
          poVar6 = ::operator<<(poVar6,(cmScriptGeneratorIndent)indent.Level);
          poVar6 = std::operator<<(poVar6,"  -change \"");
          poVar6 = std::operator<<(poVar6,(string *)ppVar7);
          poVar6 = std::operator<<(poVar6,"\" \"");
          poVar6 = std::operator<<(poVar6,(string *)&ppVar7->second);
          std::operator<<(poVar6,"\"");
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&__end2_1);
        }
        poVar6 = std::operator<<(os,"\n");
        poVar6 = ::operator<<(poVar6,(cmScriptGeneratorIndent)indent.Level);
        poVar6 = std::operator<<(poVar6,"  \"");
        poVar6 = std::operator<<(poVar6,(string *)installNameTool.field_2._8_8_);
        std::operator<<(poVar6,"\")\n");
      }
      std::__cxx11::string::~string((string *)(for_build_1.field_2._M_local_buf + 8));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&cli);
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    }
    else {
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    }
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (cmGeneratorTarget const* tgt : sharedLibs) {
      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree();
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree();

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = for_install;
      new_id += this->GetInstallFilename(this->Target, config, NameSO);
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (auto const& i : install_name_remap) {
      os << "\n"
         << indent << "  -change \"" << i.first << "\" \"" << i.second << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}